

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

void __thiscall FListMenuItem::DrawSelector(FListMenuItem *this,int xofs,int yofs,FTextureID tex)

{
  EColorRange normalcolor;
  FFont *font;
  DFrameBuffer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FTexture *img;
  int yofs_local;
  int xofs_local;
  FListMenuItem *this_local;
  FTextureID tex_local;
  
  this_local._4_4_ = tex.texnum;
  bVar1 = FTextureID::isNull((FTextureID *)((long)&this_local + 4));
  this_00 = screen;
  font = ConFont;
  normalcolor = OptionSettings.mFontColorSelection;
  if (bVar1) {
    if (DMenu::MenuTime % 8 < 6) {
      iVar2 = (this->mXpos + xofs + -0xa0) * CleanXfac;
      iVar3 = DCanvas::GetWidth((DCanvas *)screen);
      iVar4 = (this->mYpos + yofs + -100) * CleanYfac;
      iVar5 = DCanvas::GetHeight((DCanvas *)screen);
      DCanvas::DrawText((DCanvas *)this_00,font,normalcolor,iVar2 + iVar3 / 2,iVar4 + iVar5 / 2,"\r"
                        ,0x400013b8,CleanXfac << 3,0x400013b9,CleanYfac << 3,0);
    }
  }
  else {
    img = FTextureManager::operator()(&TexMan,this_local._4_4_,false);
    DCanvas::DrawTexture
              ((DCanvas *)this_00,img,(double)(this->mXpos + xofs),(double)(this->mYpos + yofs),
               0x40001390,1,0);
  }
  return;
}

Assistant:

void FListMenuItem::DrawSelector(int xofs, int yofs, FTextureID tex)
{
	if (tex.isNull())
	{
		if ((DMenu::MenuTime%8) < 6)
		{
			screen->DrawText(ConFont, OptionSettings.mFontColorSelection,
				(mXpos + xofs - 160) * CleanXfac + screen->GetWidth() / 2,
				(mYpos + yofs - 100) * CleanYfac + screen->GetHeight() / 2,
				"\xd",
				DTA_CellX, 8 * CleanXfac,
				DTA_CellY, 8 * CleanYfac,
				TAG_DONE);
		}
	}
	else
	{
		screen->DrawTexture (TexMan(tex), mXpos + xofs, mYpos + yofs, DTA_Clean, true, TAG_DONE);
	}
}